

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void __thiscall
server_context::cancel_tasks
          (server_context *this,
          unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *id_tasks)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  common_log *log;
  _Hash_node_base *p_Var2;
  vector<server_task,_std::allocator<server_task>_> cancel_tasks;
  vector<server_task,_std::allocator<server_task>_> local_7a8;
  server_task local_788;
  
  local_7a8.super__Vector_base<server_task,_std::allocator<server_task>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_7a8.super__Vector_base<server_task,_std::allocator<server_task>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_7a8.super__Vector_base<server_task,_std::allocator<server_task>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::reserve
            (&local_7a8,(id_tasks->_M_h)._M_element_count);
  p_Var2 = (id_tasks->_M_h)._M_before_begin._M_nxt;
  if (p_Var2 != (_Hash_node_base *)0x0) {
    paVar1 = &local_788.slot_action.filepath.field_2;
    do {
      if (-1 < common_log_verbosity_thold) {
        log = common_log_main();
        common_log_add(log,GGML_LOG_LEVEL_WARN,"srv  %12.*s: cancel task, id_task = %d\n",0xc,
                       "cancel_tasks",(ulong)*(uint *)&p_Var2[1]._M_nxt);
      }
      local_788.id = -1;
      local_788.index = -1;
      local_788.type = SERVER_TASK_TYPE_CANCEL;
      local_788.id_target = -1;
      slot_params::slot_params(&local_788.params);
      local_788.prompt_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_788.prompt_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_788.prompt_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_788.id_selected_slot = -1;
      local_788.slot_action.filename._M_dataplus._M_p =
           (pointer)&local_788.slot_action.filename.field_2;
      local_788.slot_action.filename._M_string_length = 0;
      local_788.slot_action.filename.field_2._M_local_buf[0] = '\0';
      local_788.slot_action.filepath._M_string_length = 0;
      local_788.slot_action.filepath.field_2._M_local_buf[0] = '\0';
      local_788.metrics_reset_bucket = false;
      local_788.set_lora.
      super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_788.set_lora.
      super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
      _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_788.set_lora.
      super__Vector_base<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_788.id_target = *(int *)&p_Var2[1]._M_nxt;
      local_788.slot_action.filepath._M_dataplus._M_p = (pointer)paVar1;
      server_response::remove_waiting_task_id(&this->queue_results,*(int *)&p_Var2[1]._M_nxt);
      httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::
      emplace_back<server_task>(&local_7a8,&local_788);
      httplib::detail::std::
      vector<common_adapter_lora_info,_std::allocator<common_adapter_lora_info>_>::~vector
                (&local_788.set_lora);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788.slot_action.filepath._M_dataplus._M_p != paVar1) {
        operator_delete(local_788.slot_action.filepath._M_dataplus._M_p,
                        CONCAT71(local_788.slot_action.filepath.field_2._M_allocated_capacity._1_7_,
                                 local_788.slot_action.filepath.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_788.slot_action.filename._M_dataplus._M_p !=
          &local_788.slot_action.filename.field_2) {
        operator_delete(local_788.slot_action.filename._M_dataplus._M_p,
                        CONCAT71(local_788.slot_action.filename.field_2._M_allocated_capacity._1_7_,
                                 local_788.slot_action.filename.field_2._M_local_buf[0]) + 1);
      }
      if (local_788.prompt_tokens.super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_788.prompt_tokens.super__Vector_base<int,_std::allocator<int>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_788.prompt_tokens.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_788.prompt_tokens.super__Vector_base<int,_std::allocator<int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      slot_params::~slot_params(&local_788.params);
      p_Var2 = p_Var2->_M_nxt;
    } while (p_Var2 != (_Hash_node_base *)0x0);
  }
  server_queue::post(&this->queue_tasks,&local_7a8,true);
  httplib::detail::std::vector<server_task,_std::allocator<server_task>_>::~vector(&local_7a8);
  return;
}

Assistant:

void cancel_tasks(const std::unordered_set<int> & id_tasks) {
        std::vector<server_task> cancel_tasks;
        cancel_tasks.reserve(id_tasks.size());
        for (const auto & id_task : id_tasks) {
            SRV_WRN("cancel task, id_task = %d\n", id_task);

            server_task task(SERVER_TASK_TYPE_CANCEL);
            task.id_target = id_task;
            queue_results.remove_waiting_task_id(id_task);
            cancel_tasks.push_back(std::move(task));
        }
        // push to beginning of the queue, so it has highest priority
        queue_tasks.post(std::move(cancel_tasks), true);
    }